

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IFCReaderGen_2x3.h
# Opt level: O2

void __thiscall Assimp::IFC::Schema_2x3::IfcCircle::IfcCircle(IfcCircle *this)

{
  *(undefined ***)&this->field_0x68 = &PTR__Object_007631c0;
  *(undefined8 *)&this->field_0x70 = 0;
  *(char **)&this->field_0x78 = "IfcCircle";
  IfcConic::IfcConic(&this->super_IfcConic,&PTR_construction_vtable_24__0080ce28);
  *(undefined8 *)&(this->super_IfcConic).field_0x58 = 0;
  (this->super_IfcConic).super_IfcCurve.super_IfcGeometricRepresentationItem.
  super_IfcRepresentationItem.
  super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcRepresentationItem,_0UL>._vptr_ObjectHelper =
       (_func_int **)0x80cd48;
  *(undefined8 *)&this->field_0x68 = 0x80ce10;
  *(undefined8 *)
   &(this->super_IfcConic).super_IfcCurve.super_IfcGeometricRepresentationItem.
    super_IfcRepresentationItem.
    super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcRepresentationItem,_0UL>.field_0x10 = 0x80cd70;
  *(undefined8 *)
   &(this->super_IfcConic).super_IfcCurve.super_IfcGeometricRepresentationItem.
    super_IfcRepresentationItem.
    super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcRepresentationItem,_0UL>.field_0x20 = 0x80cd98;
  *(undefined8 *)
   &(this->super_IfcConic).super_IfcCurve.super_IfcGeometricRepresentationItem.field_0x30 = 0x80cdc0
  ;
  *(undefined8 *)&(this->super_IfcConic).field_0x50 = 0x80cde8;
  return;
}

Assistant:

IfcCircle() : Object("IfcCircle") {}